

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int GetLatestData2MT(MT *pMT,MTDATA *pMTData)

{
  ushort uVar1;
  ushort uVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  ushort uVar6;
  MTDATA *pValue;
  int offset;
  int OutputSettings;
  char *__s;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double local_960;
  double local_958;
  double pitch;
  double yaw;
  double roll;
  int local_934;
  double *local_930;
  double *local_928;
  double *local_920;
  double *local_918;
  double *local_910;
  double *local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  double *local_8e0;
  double *local_8d8;
  double *local_8d0;
  double *local_8c8;
  double *local_8c0;
  double *local_8b8;
  MTDATA *local_8b0;
  double *local_8a8;
  double *local_8a0;
  MTDATA *local_898;
  double *local_890;
  double *local_888;
  MTDATA *local_880;
  double *local_878;
  double *local_870;
  MTDATA *local_868;
  double *local_860;
  MTDATA *local_858;
  MTDATA *local_850;
  double *local_848;
  double *local_840;
  uchar databuf [2048];
  
  roll = 0.0;
  pitch = 0.0;
  yaw = 0.0;
  memset(databuf,0,0x800);
  local_934 = 0;
  iVar5 = GetLatestMTMessageMT(pMT,0xff,0x36,databuf,0x800,&local_934);
  if (iVar5 != 0) {
    return 1;
  }
  memset(pMTData,0,0x130);
  if (local_934 < 3) {
    __s = "Error reading data from a MT : Empty MTDATA2 message. ";
LAB_0018261a:
    puts(__s);
    return 1;
  }
  local_840 = &pMTData->Vel_X;
  local_848 = &pMTData->Vel_Y;
  local_850 = (MTDATA *)&pMTData->Vel_Z;
  local_858 = (MTDATA *)&pMTData->Alt;
  local_860 = &pMTData->Lat;
  local_868 = (MTDATA *)&pMTData->Long;
  local_870 = &pMTData->magX;
  local_878 = &pMTData->magY;
  local_880 = (MTDATA *)&pMTData->magZ;
  local_888 = &pMTData->gyrX;
  local_890 = &pMTData->gyrY;
  local_898 = (MTDATA *)&pMTData->gyrZ;
  local_8a0 = &pMTData->accX;
  local_8a8 = &pMTData->accY;
  local_8b0 = (MTDATA *)&pMTData->accZ;
  local_8b8 = &pMTData->a;
  local_8c0 = &pMTData->b;
  local_930 = &pMTData->c;
  local_8c8 = &pMTData->d;
  local_8d0 = &pMTData->e;
  local_8d8 = &pMTData->f;
  local_8e0 = &pMTData->g;
  local_8e8 = &pMTData->h;
  local_8f0 = &pMTData->i;
  local_8f8 = &pMTData->roll;
  local_900 = &pMTData->pitch;
  local_908 = &pMTData->yaw;
  local_910 = &pMTData->q0;
  local_918 = &pMTData->q1;
  local_920 = &pMTData->q2;
  local_928 = &pMTData->q3;
  iVar5 = 0;
LAB_00181ef1:
  while( true ) {
    while( true ) {
      while( true ) {
        offset = iVar5 + 3;
        if (local_934 < offset) {
          memcpy(&pMT->LastMTData,pMTData,0x130);
          return 0;
        }
        iVar7 = (uint)databuf[(long)iVar5 + 2] + offset;
        if (local_934 < iVar7) {
          __s = "Error reading data from a MT : Bad packet. ";
          goto LAB_0018261a;
        }
        uVar1 = *(ushort *)(databuf + iVar5) << 8;
        uVar2 = *(ushort *)(databuf + iVar5) >> 8;
        if ((uVar1 | uVar2 & 0xfff0) != 0xe010) break;
        pMTData->Status = databuf[(long)iVar5 + 3];
        iVar5 = iVar5 + 4;
      }
      uVar6 = uVar1 | uVar2 & 0xfff0;
      if (uVar6 != 0x1010) break;
      uVar1 = *(ushort *)(databuf + (long)iVar5 + 5);
      (pMTData->UTCTime).Nanoseconds =
           CONCAT13(databuf[(long)iVar5 + 3],
                    CONCAT12(databuf[(long)iVar5 + 4],uVar1 << 8 | uVar1 >> 8));
      uVar1 = *(ushort *)(databuf + (long)iVar5 + 7);
      (pMTData->UTCTime).Year = uVar1 << 8 | uVar1 >> 8;
      (pMTData->UTCTime).Month = databuf[(long)iVar5 + 9];
      (pMTData->UTCTime).Day = databuf[(long)iVar5 + 10];
      (pMTData->UTCTime).Hour = databuf[(long)iVar5 + 0xb];
      (pMTData->UTCTime).Minute = databuf[(long)iVar5 + 0xc];
      (pMTData->UTCTime).Seconds = databuf[(long)iVar5 + 0xd];
      (pMTData->UTCTime).Valid = databuf[(long)iVar5 + 0xe];
      iVar5 = iVar5 + 0xf;
    }
    if (uVar6 != 0x1020) break;
    pMTData->TS = CONCAT11(databuf[(long)iVar5 + 3],databuf[(long)iVar5 + 4]);
    iVar5 = iVar5 + 5;
  }
  OutputSettings = (uint)(uVar1 | uVar2) << 2;
  if (uVar6 == 0x2010) {
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_910);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_918);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_920);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_928);
    quaternion2euler(pMTData->q0,pMTData->q1,pMTData->q2,pMTData->q3,&roll,&pitch,&yaw);
    auVar12._0_8_ = roll * 180.0;
    auVar12._8_8_ = pitch * 180.0;
    auVar12 = divpd(auVar12,_DAT_0018d540);
    pMTData->roll = (double)auVar12._0_8_;
    pMTData->pitch = (double)auVar12._8_8_;
    pMTData->yaw = (yaw * 180.0) / 3.141592653589793;
LAB_001824ed:
    local_958 = pMT->rollorientation + roll;
    local_960 = pMT->rollp1;
    dVar8 = roll + pMT->rollp2;
  }
  else {
    if (uVar6 != 0x2020) {
      if (uVar6 == 0x2030) {
        iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_8f8);
        iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_900);
        iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_908);
        roll = (pMTData->roll * 3.141592653589793) / 180.0;
        pitch = (pMTData->pitch * 3.141592653589793) / 180.0;
        yaw = (pMTData->yaw * 3.141592653589793) / 180.0;
        goto LAB_001824ed;
      }
      if (uVar6 == 0x4020) {
        iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_8a0);
        offset = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8a8);
        pValue = local_8b0;
      }
      else {
        pValue = local_858;
        if (uVar6 != 0x5020) {
          if (uVar6 == 0x5040) {
            offset = ConvertToDoubleMT(OutputSettings,databuf,offset,local_860);
            pValue = local_868;
          }
          else {
            if (uVar6 != 0x8020) {
              if (uVar6 == 0xb010) {
                pMTData->Ain_1 = CONCAT11(databuf[(long)iVar5 + 3],databuf[(long)iVar5 + 4]);
              }
              else {
                if (uVar6 != 0xb020) {
                  if (uVar6 == 0xc020) {
                    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_870);
                    offset = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_878);
                    pValue = local_880;
                  }
                  else {
                    if (uVar6 == 0xd010) {
                      iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_840);
                      offset = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_848);
                      pValue = local_850;
                      goto LAB_001825e4;
                    }
                    pValue = pMTData;
                    iVar5 = iVar7;
                    if (uVar6 != 0x810) goto LAB_00181ef1;
                  }
                  goto LAB_001825e4;
                }
                pMTData->Ain_2 = CONCAT11(databuf[(long)iVar5 + 3],databuf[(long)iVar5 + 4]);
              }
              iVar5 = iVar5 + 5;
              goto LAB_00181ef1;
            }
            iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_888);
            offset = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_890);
            pValue = local_898;
          }
        }
      }
LAB_001825e4:
      iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,&pValue->temp);
      goto LAB_00181ef1;
    }
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,offset,local_8b8);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8c0);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_930);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8c8);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8d0);
    pdVar4 = local_8d8;
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8d8);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8e0);
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8e8);
    pdVar3 = local_8f0;
    iVar5 = ConvertToDoubleMT(OutputSettings,databuf,iVar5,local_8f0);
    roll = atan2(*pdVar4,*pdVar3);
    dVar8 = *local_930;
    dVar9 = -1.0;
    if ((-1.0 <= dVar8) && (dVar9 = 1.0, dVar8 <= 1.0)) {
      dVar9 = dVar8;
    }
    dVar8 = asin(dVar9);
    pitch = -dVar8;
    yaw = atan2(pMTData->b,pMTData->a);
    auVar11._0_8_ = roll * 180.0;
    auVar11._8_8_ = pitch * 180.0;
    auVar12 = divpd(auVar11,_DAT_0018d540);
    pMTData->roll = (double)auVar12._0_8_;
    pMTData->pitch = (double)auVar12._8_8_;
    pMTData->yaw = (yaw * 180.0) / 3.141592653589793;
    local_958 = pMT->rollorientation + roll;
    local_960 = pMT->rollp1;
    dVar8 = roll + pMT->rollp2;
  }
  dVar8 = cos(dVar8);
  dVar8 = fmod_2PI(dVar8 * local_960 + local_958);
  pMTData->Roll = dVar8;
  dVar10 = pMT->pitchorientation + pitch;
  dVar8 = pMT->pitchp1;
  dVar9 = cos(pitch + pMT->pitchp2);
  dVar8 = fmod_2PI(dVar9 * dVar8 + dVar10);
  pMTData->Pitch = dVar8;
  dVar10 = pMT->yaworientation + yaw;
  dVar8 = pMT->yawp1;
  dVar9 = cos(yaw + pMT->yawp2);
  dVar8 = fmod_2PI(dVar9 * dVar8 + dVar10);
  pMTData->Yaw = dVar8;
  goto LAB_00181ef1;
}

Assistant:

inline int GetLatestData2MT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	int dataidentifier = 0;
	int size = 0;
	int precisionoutputsettings = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA2_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (nbdatabytes < 3) 
	{
		printf("Error reading data from a MT : Empty MTDATA2 message. \n");
		return EXIT_FAILURE;
	}

	// Might not be good if all data are not at the same output frequency...?

	while (nbdatabytes >= offset+3) 
	{
		// Get Data Identifier and Size of the packet.
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		dataidentifier = us.v;
		size = databuf[2+offset];
		offset += 3;
		if (nbdatabytes < offset+size) 
		{
			printf("Error reading data from a MT : Bad packet. \n");
			return EXIT_FAILURE;
		}
		precisionoutputsettings = (dataidentifier<<2);
		switch (dataidentifier & XDI_FullTypeMask)
		{
		case XDI_Temperature:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->temp);
			break;
		case XDI_UtcTime:
			ul.c[0] = databuf[3+offset];
			ul.c[1] = databuf[2+offset];
			ul.c[2] = databuf[1+offset];
			ul.c[3] = databuf[0+offset];
			pMTData->UTCTime.Nanoseconds = ul.v;
			offset += 4;
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->UTCTime.Year = us.v;
			offset += 2;
			pMTData->UTCTime.Month = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Day = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Hour = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Minute = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Seconds = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Valid = databuf[offset];
			offset += 1;
			break;
		case XDI_PacketCounter:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->TS = us.v;
			offset += 2;
			break;
		case XDI_Quaternion:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_EulerAngles:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
	
			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_RotationMatrix:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
		
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_Acceleration:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accZ);
			break;
		case XDI_RateOfTurn:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrZ);
			break;
		case XDI_MagneticField:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magZ);
			break;
		case XDI_StatusByte:
			pMTData->Status = databuf[offset];
			offset += 1;
			break;
		case XDI_AnalogIn1:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
			break;
		case XDI_AnalogIn2:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
			break;
		case XDI_LatLon:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Lat);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Long);
			break;
		case XDI_AltitudeEllipsoid:
			// Altitude Mean Sea Level or WGS84 in MTDATA message?
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Alt);
			break;
		case XDI_VelocityXYZ:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_X);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Y);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Z);
			break;
		default:
			// Skipping an unknown packet...
			offset += size;
			break;
		}
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}